

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

_Bool is_in_array(int *hay,size_t length,int needle)

{
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  if (length == 0) {
    _Var1 = false;
  }
  else {
    iVar2 = *hay;
    _Var1 = true;
    if (iVar2 != needle) {
      bVar4 = true;
      uVar3 = 1;
      do {
        if (needle < iVar2) {
          iVar2 = 0;
          goto LAB_0010120a;
        }
        bVar4 = uVar3 < length;
        if (uVar3 == length) goto LAB_0010120a;
        iVar2 = hay[uVar3];
        uVar3 = uVar3 + 1;
      } while (iVar2 != needle);
      iVar2 = 1;
LAB_0010120a:
      _Var1 = (_Bool)(bVar4 & (byte)iVar2);
    }
  }
  return _Var1;
}

Assistant:

bool is_in_array(const int* hay, const size_t length, const int needle) {
  for (size_t n = 0; n < length; n++) {
    if (hay[n] == needle) return true;
    else if (hay[n] > needle) return false;
  }
  return false;
}